

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraRay> * __thiscall
pbrt::SphericalCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,SphericalCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  CameraSample CVar2;
  float sinTheta;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [12];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Vector3f VVar13;
  Tuple2<pbrt::Point2,_float> local_88;
  anon_struct_8_0_00000001_for___align local_80;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  undefined8 uStack_6c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_60;
  SampledSpectrum local_58;
  Ray local_48;
  undefined1 extraout_var_00 [56];
  undefined1 auVar8 [56];
  undefined1 auVar12 [60];
  
  CVar2 = sample;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar9._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
  auVar12 = ZEXT460((uint)CVar2.pFilm.super_Tuple2<pbrt::Point2,_float>.y);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)((this->super_CameraBase).film.
                            super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                           0xffffffffffff);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vdivps_avx(auVar9,auVar4);
  local_88 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4);
  if (this->mapping == EquiRectangular) {
    auVar9 = vmovshdup_avx(auVar4);
    fVar3 = auVar9._0_4_ * 3.1415927;
    sinTheta = sinf(fVar3);
    fVar3 = cosf(fVar3);
    auVar12 = ZEXT1260(extraout_var);
    auVar8 = (undefined1  [56])0x0;
    VVar13 = SphericalDirection(sinTheta,fVar3,auVar4._0_4_ * 6.2831855);
    auVar11._0_4_ = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._4_60_ = auVar12;
    auVar9 = auVar11._0_16_;
    auVar7._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar8;
    auVar4 = auVar7._0_16_;
  }
  else {
    auVar5._0_8_ = WrapEqualAreaSquare((Point2f)local_88);
    auVar5._8_56_ = extraout_var_00;
    local_88 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar5._0_16_);
    auVar8 = extraout_var_00;
    VVar13 = EqualAreaSquareToSphere((Point2f *)&local_88);
    auVar10._0_4_ = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10._4_60_ = auVar12;
    auVar9 = auVar10._0_16_;
    auVar6._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar8;
    auVar4 = auVar6._0_16_;
  }
  local_48.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_CameraBase).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar9 = vinsertps_avx(auVar4,auVar9,0x10);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(sample.time * (this->super_CameraBase).shutterClose)),
                           ZEXT416((uint)(1.0 - sample.time)),
                           ZEXT416((uint)(this->super_CameraBase).shutterOpen));
  local_48.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_48.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_48.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_48.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar9);
  local_48.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)vextractps_avx(auVar4,1);
  local_48.time = auVar1._0_4_;
  CameraTransform::RenderFromCamera((Ray *)&local_80,(CameraTransform *)this,&local_48);
  SampledSpectrum::SampledSpectrum(&local_58,1.0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_80;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_74,fStack_78);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_70,fStack_74);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_6c;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_60.bits;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
       local_58.values.values._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       local_58.values.values._8_8_;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> SphericalCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Compute spherical camera ray direction
    Point2f uv(sample.pFilm.x / film.FullResolution().x,
               sample.pFilm.y / film.FullResolution().y);
    Vector3f dir;
    if (mapping == EquiRectangular) {
        // Compute ray direction using equirectangular mapping
        Float theta = Pi * uv[1], phi = 2 * Pi * uv[0];
        dir = SphericalDirection(std::sin(theta), std::cos(theta), phi);

    } else {
        // Compute ray direction using equal area mapping
        uv = WrapEqualAreaSquare(uv);
        dir = EqualAreaSquareToSphere(uv);
    }
    pstd::swap(dir.y, dir.z);

    Ray ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    return CameraRay{RenderFromCamera(ray)};
}